

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JlDataModel.c
# Opt level: O1

JL_STATUS JlAttachObjectToDictionaryObject
                    (JlDataObject *DictionaryObject,char *KeyName,JlDataObject *NewObject)

{
  JlListItem *pJVar1;
  int iVar2;
  JlDictionaryItem *pJVar3;
  char *pcVar4;
  JL_STATUS JVar5;
  JlListItem *pJVar6;
  
  JVar5 = JL_STATUS_INVALID_PARAMETER;
  if ((((KeyName != (char *)0x0 && DictionaryObject != (JlDataObject *)0x0) &&
       (NewObject != (JlDataObject *)0x0)) && (*KeyName != '\0')) &&
     (JVar5 = JL_STATUS_WRONG_TYPE, DictionaryObject->Type == JL_DATA_TYPE_DICTIONARY)) {
    pJVar6 = (JlListItem *)&DictionaryObject->field_2;
    pJVar3 = (JlDictionaryItem *)pJVar6;
    do {
      pJVar3 = pJVar3->Next;
      if (pJVar3 == (JlDictionaryItem *)0x0) goto LAB_00101c0a;
      iVar2 = strcmp(KeyName,pJVar3->KeyName);
    } while (iVar2 != 0);
    JVar5 = JL_STATUS_DICTIONARY_ITEM_REPEATED;
    if (pJVar3->Object == (JlDataObject *)0x0) {
LAB_00101c0a:
      pJVar3 = (JlDictionaryItem *)WjTestLib_Calloc(0x20,1);
      JVar5 = JL_STATUS_OUT_OF_MEMORY;
      if (pJVar3 != (JlDictionaryItem *)0x0) {
        pJVar3->Next = (JlDictionaryItem *)0x0;
        pJVar3->Object = NewObject;
        pJVar3->ParentDictionary = (JlDictionary *)pJVar6;
        pcVar4 = JlStrDup(KeyName);
        pJVar3->KeyName = pcVar4;
        if (pcVar4 == (char *)0x0) {
          WjTestLib_Free(pJVar3);
        }
        else {
          pJVar1 = (DictionaryObject->field_2).List.ListHead;
          if (pJVar1 != (JlListItem *)0x0) {
            pJVar6 = pJVar1;
          }
          pJVar6->Next = (JlListItem *)pJVar3;
          (DictionaryObject->field_2).List.ListHead = (JlListItem *)pJVar3;
          JVar5 = JL_STATUS_SUCCESS;
        }
      }
    }
  }
  return JVar5;
}

Assistant:

JL_STATUS
    JlAttachObjectToDictionaryObject
    (
        JlDataObject*   DictionaryObject,
        char const*     KeyName,
        JlDataObject*   NewObject
    )
{
    JL_STATUS jlStatus;

    if(     NULL != DictionaryObject
        &&  NULL != KeyName
        &&  0 != KeyName[0]
        &&  NULL != NewObject )
    {
        if( JL_DATA_TYPE_DICTIONARY == DictionaryObject->Type )
        {
            // Check key does not already exist
            if( NULL == FindDictionaryItem( &DictionaryObject->Dictionary, KeyName ) )
            {
                // Create dictionary item container for object
                JlDictionaryItem* dictionaryItem = JlNew( JlDictionaryItem );
                if( NULL != dictionaryItem )
                {
                    dictionaryItem->Next = NULL;
                    dictionaryItem->Object = NewObject;
                    dictionaryItem->ParentDictionary = &DictionaryObject->Dictionary;
                    dictionaryItem->KeyName = JlStrDup( KeyName );
                    if( NULL != dictionaryItem->KeyName )
                    {
                        JlLinkedListAddToEnd( DictionaryObject->Dictionary.DictionaryHead, DictionaryObject->Dictionary.DictionaryTail, dictionaryItem );
                        jlStatus = JL_STATUS_SUCCESS;
                    }
                    else
                    {
                        jlStatus = JL_STATUS_OUT_OF_MEMORY;
                        JlFree( dictionaryItem );
                        dictionaryItem = NULL;
                    }
                }
                else
                {
                    jlStatus = JL_STATUS_OUT_OF_MEMORY;
                }
            }
            else
            {
                jlStatus = JL_STATUS_DICTIONARY_ITEM_REPEATED;
            }
        }
        else
        {
            jlStatus = JL_STATUS_WRONG_TYPE;
        }
    }
    else
    {
        jlStatus = JL_STATUS_INVALID_PARAMETER;
    }

    return jlStatus;
}